

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O1

handle_base * __thiscall
printable_sbo_cow::handle<large_printable,_true>::clone_into
          (handle<large_printable,_true> *this,buffer *buf)

{
  handle_base *phVar1;
  vector<double,_std::allocator<double>_> local_2028 [342];
  
  std::vector<double,_std::allocator<double>_>::vector(local_2028,&(this->value_).data_);
  allocations()::allocations_ = allocations()::allocations_ + 1;
  phVar1 = (handle_base *)malloc(0x2028);
  phVar1->_vptr_handle_base = (_func_int **)&PTR__handle_001132f0;
  phVar1[1]._vptr_handle_base =
       (_func_int **)
       local_2028[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  phVar1[2]._vptr_handle_base =
       (_func_int **)
       local_2028[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  phVar1[3]._vptr_handle_base =
       (_func_int **)
       local_2028[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  phVar1[0x404]._vptr_handle_base = (_func_int **)0x1;
  return phVar1;
}

Assistant:

virtual handle_base * clone_into (buffer & buf) const
        { return clone_impl(value_, buf); }